

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations
          (MultiAgentDecisionProcessDiscreteFactoredStates *this)

{
  Scope *in_stack_00000060;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_00000068;
  
  GetNrStateFactorInstantiations(in_stack_00000068,in_stack_00000060);
  return;
}

Assistant:

size_t MultiAgentDecisionProcessDiscreteFactoredStates::GetNrStateFactorInstantiations(const Scope& sfScope) const
{
    if(sfScope.size()>0)
    {
        const vector<size_t>& nrSFvals = GetNrValuesPerFactor();
        vector<size_t> restr_nrSFvals(sfScope.size());
        IndexTools::RestrictIndividualIndicesToScope( nrSFvals, sfScope, restr_nrSFvals );
        size_t restr_nrJSFvals = VectorTools::VectorProduct(restr_nrSFvals);
        return restr_nrJSFvals;
    }
    else
        return(0);
}